

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall
sentencepiece::NormalizerSpec::InternalSwap(NormalizerSpec *this,NormalizerSpec *other)

{
  InternalMetadata *this_00;
  MessageLite *this_01;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__a;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__b;
  long in_RSI;
  long in_RDI;
  string *in_stack_fffffffffffffeb8;
  InternalMetadata *in_stack_fffffffffffffec0;
  InternalMetadata *in_stack_fffffffffffffef0;
  ExtensionSet *in_stack_fffffffffffffef8;
  ExtensionSet *in_stack_ffffffffffffff00;
  
  google::protobuf::internal::ExtensionSet::Swap
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  this_00 = (InternalMetadata *)(in_RSI + 8);
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) != 1) {
    if (((uint)this_00->ptr_ & 1) != 1) goto LAB_0045d9b3;
  }
  if (((uint)this_00->ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadata::
    PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>(this_00)
    ;
  }
  else {
    google::protobuf::internal::InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
              (in_stack_fffffffffffffef0);
  }
  google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
LAB_0045d9b3:
  std::swap<unsigned_int>((uint *)(in_RDI + 0x28),(uint *)(in_RSI + 0x28));
  this_01 = (MessageLite *)(in_RDI + 0x30);
  google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::MessageLite::GetArena(this_01);
  std::swap<google::protobuf::internal::TaggedPtr<std::__cxx11::string>>
            ((TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_01,
             (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(in_RSI + 0x30));
  google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::MessageLite::GetArena(this_01);
  std::swap<google::protobuf::internal::TaggedPtr<std::__cxx11::string>>
            ((TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(in_RDI + 0x38),
             (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(in_RSI + 0x38));
  __a = (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(in_RDI + 0x40);
  __b = (TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(in_RSI + 0x40);
  google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::MessageLite::GetArena(this_01);
  std::swap<google::protobuf::internal::TaggedPtr<std::__cxx11::string>>(__a,__b);
  std::swap<bool>((bool *)(in_RDI + 0x48),(bool *)(in_RSI + 0x48));
  std::swap<bool>((bool *)(in_RDI + 0x49),(bool *)(in_RSI + 0x49));
  std::swap<bool>((bool *)(in_RDI + 0x4a),(bool *)(in_RSI + 0x4a));
  return;
}

Assistant:

void NormalizerSpec::InternalSwap(NormalizerSpec* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  precompiled_charsmap_.Swap(&other->precompiled_charsmap_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  normalization_rule_tsv_.Swap(&other->normalization_rule_tsv_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(add_dummy_prefix_, other->add_dummy_prefix_);
  swap(remove_extra_whitespaces_, other->remove_extra_whitespaces_);
  swap(escape_whitespaces_, other->escape_whitespaces_);
}